

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O1

void Mfs_ManPrint(Mfs_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  if (p->pPars->fResub == 0) {
    printf("Nodes = %d. Try = %d. Total mints = %d. Local DC mints = %d. Ratio = %5.2f.\n",
           (double)(p->nMintsTotal - p->nMintsCare) / (double)p->nMintsTotal,
           (ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried);
    iVar2 = 0x879414;
    printf("Nodes resyn = %d. Ratio = %5.2f.  Total AIG node gain = %d. Timeouts = %d.\n",
           (double)p->nNodesDec / (double)p->nNodesTried,(ulong)(uint)p->nNodesDec,
           (ulong)(uint)p->nNodesGained,(ulong)(uint)p->nTimeOuts);
  }
  else {
    printf("Nodes = %d. Try = %d. Resub = %d. Div = %d. SAT calls = %d. Timeouts = %d. MaxDivs = %d.\n"
           ,(ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nNodesResub,
           (ulong)(uint)p->nTotalDivs,(ulong)(uint)p->nSatCalls,(ulong)(uint)p->nTimeOuts,
           (ulong)(uint)p->nMaxDivs);
    printf("Attempts :   ");
    iVar2 = 1;
    if (1 < p->nTryRemoves) {
      iVar2 = p->nTryRemoves;
    }
    printf("Remove %6d out of %6d (%6.2f %%)   ",((double)p->nRemoves * 100.0) / (double)iVar2);
    iVar2 = 1;
    if (1 < p->nTryResubs) {
      iVar2 = p->nTryResubs;
    }
    printf("Resub  %6d out of %6d (%6.2f %%)   ",((double)p->nResubs * 100.0) / (double)iVar2);
    putchar(10);
    printf("Reduction:   ");
    iVar2 = p->nTotalNodesBeg;
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    printf("Nodes  %6d out of %6d (%6.2f %%)   ",
           ((double)(iVar2 - p->nTotalNodesEnd) * 100.0) / (double)iVar3);
    iVar2 = p->nTotalEdgesBeg;
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    printf("Edges  %6d out of %6d (%6.2f %%)   ",
           ((double)(iVar2 - p->nTotalEdgesEnd) * 100.0) / (double)iVar3);
    iVar2 = 10;
    putchar(10);
    if (p->pPars->fPower != 0) {
      dVar6 = (double)(p->TotalSwitchingBeg - p->TotalSwitchingEnd);
      iVar2 = 0x879376;
      printf("Power( %5.2f, %4.2f%%) \n",dVar6,(dVar6 * 100.0) / (double)p->TotalSwitchingBeg);
    }
    if (p->pPars->fSwapEdge != 0) {
      uVar1 = p->nNodesResub;
      uVar4 = Abc_NtkGetTotalFanins(p->pNtk);
      iVar3 = p->nNodesResub;
      iVar5 = Abc_NtkGetTotalFanins(p->pNtk);
      iVar2 = 0x87938f;
      printf("Swappable edges = %d. Total edges = %d. Ratio = %5.2f.\n",
             (double)iVar3 / (double)iVar5,(ulong)uVar1,(ulong)uVar4);
    }
  }
  Abc_Print(iVar2,"%s =","Win");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","Div");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeDiv * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeDiv / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","Aig");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeAig * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeAig / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","Gia");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeGia * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeGia / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","Cnf");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","Sat");
  dVar7 = (double)(p->timeSat - p->timeInt);
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = (dVar7 * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",dVar7 / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","Int");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeInt * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeInt / 1000000.0,dVar6);
  Abc_Print(iVar2,"%s =","ALL");
  dVar6 = (double)p->timeTotal;
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = (dVar6 * 100.0) / dVar6;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar7);
  return;
}

Assistant:

void Mfs_ManPrint( Mfs_Man_t * p )
{
    if ( p->pPars->fResub )
    {
        printf( "Nodes = %d. Try = %d. Resub = %d. Div = %d. SAT calls = %d. Timeouts = %d. MaxDivs = %d.\n",
            p->nTotalNodesBeg, p->nNodesTried, p->nNodesResub, p->nTotalDivs, p->nSatCalls, p->nTimeOuts, p->nMaxDivs );

        printf( "Attempts :   " );
        printf( "Remove %6d out of %6d (%6.2f %%)   ", p->nRemoves, p->nTryRemoves, 100.0*p->nRemoves/Abc_MaxInt(1, p->nTryRemoves) );
        printf( "Resub  %6d out of %6d (%6.2f %%)   ", p->nResubs,  p->nTryResubs,  100.0*p->nResubs /Abc_MaxInt(1, p->nTryResubs)  );
        printf( "\n" );

        printf( "Reduction:   " );
        printf( "Nodes  %6d out of %6d (%6.2f %%)   ", p->nTotalNodesBeg-p->nTotalNodesEnd, p->nTotalNodesBeg, 100.0*(p->nTotalNodesBeg-p->nTotalNodesEnd)/Abc_MaxInt(1, p->nTotalNodesBeg) );
        printf( "Edges  %6d out of %6d (%6.2f %%)   ", p->nTotalEdgesBeg-p->nTotalEdgesEnd, p->nTotalEdgesBeg, 100.0*(p->nTotalEdgesBeg-p->nTotalEdgesEnd)/Abc_MaxInt(1, p->nTotalEdgesBeg) );
        printf( "\n" );

        if (p->pPars->fPower)
            printf( "Power( %5.2f, %4.2f%%) \n",
                 p->TotalSwitchingBeg - p->TotalSwitchingEnd,
                 100.0*(p->TotalSwitchingBeg-p->TotalSwitchingEnd)/p->TotalSwitchingBeg );
        if ( p->pPars->fSwapEdge )
            printf( "Swappable edges = %d. Total edges = %d. Ratio = %5.2f.\n",
                p->nNodesResub, Abc_NtkGetTotalFanins(p->pNtk), 1.00 * p->nNodesResub / Abc_NtkGetTotalFanins(p->pNtk) );
//        printf( "Average ratio of DCs in the resubed nodes = %.2f.\n", 1.0*p->nDcMints/(64 * p->nNodesResub) );
    }
    else
    {
        printf( "Nodes = %d. Try = %d. Total mints = %d. Local DC mints = %d. Ratio = %5.2f.\n", 
            p->nTotalNodesBeg, p->nNodesTried, p->nMintsTotal, p->nMintsTotal-p->nMintsCare, 
            1.0 * (p->nMintsTotal-p->nMintsCare) / p->nMintsTotal );
//        printf( "Average ratio of sequential DCs in the global space = %5.2f.\n", 
//            1.0-(p->dTotalRatios/p->nNodesTried) );
        printf( "Nodes resyn = %d. Ratio = %5.2f.  Total AIG node gain = %d. Timeouts = %d.\n", 
            p->nNodesDec, 1.0 * p->nNodesDec / p->nNodesTried, p->nNodesGained, p->nTimeOuts );
    }

    ABC_PRTP( "Win", p->timeWin            ,  p->timeTotal );
    ABC_PRTP( "Div", p->timeDiv            ,  p->timeTotal );
    ABC_PRTP( "Aig", p->timeAig            ,  p->timeTotal );
    ABC_PRTP( "Gia", p->timeGia            ,  p->timeTotal );
    ABC_PRTP( "Cnf", p->timeCnf            ,  p->timeTotal );
    ABC_PRTP( "Sat", p->timeSat-p->timeInt ,  p->timeTotal );
    ABC_PRTP( "Int", p->timeInt            ,  p->timeTotal );
    ABC_PRTP( "ALL", p->timeTotal          ,  p->timeTotal );

}